

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O1

void avl_remove(avl_tree *tree,avl_node *node)

{
  avl_node *paVar1;
  uint uVar2;
  uint uVar3;
  avl_node *paVar4;
  avl_node **ppaVar5;
  avl_node *paVar6;
  ulong uVar7;
  avl_node *paVar8;
  avl_node *paVar9;
  uint uVar10;
  bool bVar11;
  avl_node *local_28;
  
  if (node != (avl_node *)0x0) {
    ppaVar5 = &local_28;
    local_28 = node->right;
    paVar6 = (avl_node *)0x0;
    do {
      paVar8 = paVar6;
      paVar6 = *ppaVar5;
      ppaVar5 = &paVar6->left;
    } while (paVar6 != (avl_node *)0x0);
    if (paVar8 == (avl_node *)0x0) {
      uVar7 = (ulong)node->parent & 0xfffffffffffffffc;
      if (uVar7 == 0) {
        uVar10 = 0;
      }
      else {
        bVar11 = *(avl_node **)(uVar7 + 8) != node;
        *(avl_node **)(uVar7 + 8 + (ulong)bVar11 * 8) = node->left;
        uVar10 = -(uint)bVar11 | 1;
      }
      paVar6 = node->left;
      if (paVar6 != (avl_node *)0x0) {
        paVar6->parent = (avl_node *)((uint)paVar6->parent & 3 | uVar7);
      }
      paVar6 = (avl_node *)((ulong)node->parent & 0xfffffffffffffffc);
    }
    else {
      paVar6 = (avl_node *)((ulong)paVar8->parent & 0xfffffffffffffffc);
      if (paVar6 != node && paVar6 != (avl_node *)0x0) {
        paVar9 = paVar8->right;
        paVar6->left = paVar9;
        if (paVar9 != (avl_node *)0x0) {
          paVar9->parent = (avl_node *)((ulong)((uint)paVar9->parent & 3) | (ulong)paVar6);
        }
      }
      uVar7 = (ulong)node->parent & 0xfffffffffffffffc;
      if (uVar7 != 0) {
        *(avl_node **)(uVar7 + 8 + (ulong)(*(avl_node **)(uVar7 + 8) != node) * 8) = paVar8;
      }
      if (node->right == paVar8) {
        uVar10 = 0xffffffff;
        paVar6 = paVar8;
      }
      else {
        paVar8->right = node->right;
        paVar6 = node->right;
        if (paVar6 != (avl_node *)0x0) {
          paVar6->parent = (avl_node *)((ulong)((uint)paVar6->parent & 3) | (ulong)paVar8);
        }
        uVar10 = 1;
        paVar6 = (avl_node *)((ulong)paVar8->parent & 0xfffffffffffffffc);
      }
      paVar8->left = node->left;
      paVar9 = node->left;
      if (paVar9 != (avl_node *)0x0) {
        paVar9->parent = (avl_node *)((ulong)((uint)paVar9->parent & 3) | (ulong)paVar8);
      }
      uVar7 = (ulong)node->parent & 0xfffffffffffffffc;
      paVar8->parent = (avl_node *)((uint)paVar8->parent & 3 | uVar7);
      paVar8->parent = (avl_node *)((uint)node->parent & 3 | uVar7);
    }
    if (((tree->root == node) && (tree->root = paVar8, paVar8 == (avl_node *)0x0)) &&
       (node->left != (avl_node *)0x0)) {
      tree->root = node->left;
    }
    do {
      if (paVar6 == (avl_node *)0x0) {
        return;
      }
      paVar8 = paVar6->parent;
      paVar9 = (avl_node *)((ulong)paVar8 & 0xfffffffffffffffc);
      if (paVar9 == (avl_node *)0x0) {
        if (paVar6 == tree->root) {
          paVar6 = _balance_tree(tree->root,uVar10);
          tree->root = paVar6;
          return;
        }
      }
      else {
        paVar1 = paVar9->right;
        paVar4 = _balance_tree(paVar6,uVar10);
        (&paVar9->left)[paVar1 == paVar6] = paVar4;
        if ((paVar4->left != (avl_node *)0x0) || (paVar4->right != (avl_node *)0x0)) {
          uVar10 = ((uint)paVar8 & 3) - 1;
          uVar2 = -uVar10;
          if (0 < (int)uVar10) {
            uVar2 = uVar10;
          }
          uVar10 = (*(uint *)&paVar4->parent & 3) - 1;
          uVar3 = -uVar10;
          if (0 < (int)uVar10) {
            uVar3 = uVar10;
          }
          uVar10 = 0;
          if (uVar2 <= uVar3) goto LAB_001180ba;
        }
        uVar10 = (uint)(paVar9->left == paVar4) * 2 - 1;
      }
LAB_001180ba:
      paVar6 = paVar9;
    } while (uVar10 != 0);
  }
  return;
}

Assistant:

void avl_remove(struct avl_tree *tree,
                struct avl_node *node)
{
    __AVL_DEBUG_REMOVE(node);

    // not found
    if (node == NULL) return;

    struct avl_tree right_subtree;
    struct avl_node *p=NULL,*cur, *next=NULL;
    int bf = 0, bf_old;


#ifdef _AVL_NEXT_POINTER
    if (node->prev) node->prev->next = node->next;
    if (node->next) node->next->prev = node->prev;
#endif

    // find smallest node in right sub-tree
    right_subtree.root = node->right;
    next = avl_first(&right_subtree);

    if (next) {
        // 1. NEXT exists
        if (avl_parent(next)) {
            if (avl_parent(next) != node) {
                // NODE is not NEXT's direct parent
                // MUST ensure NEXT should be *left child* of its parent
                // MUST ensure NEXT doesn't have right child
                avl_parent(next)->left = next->right;
                if (next->right)
                    avl_set_parent(next->right, avl_parent(next));
            }
        }
        if (avl_parent(node)) {
            // replace NODE by NEXT
            if (avl_parent(node)->left == node) {
                avl_parent(node)->left = next;
            } else {
                avl_parent(node)->right = next;
            }
        }

        // re-link pointers
        if (node->right != next) {
            next->right = node->right;
            if (node->right) avl_set_parent(node->right, next);
            cur = avl_parent(next);
            bf = 1;
        }else{
            cur = next;
            bf = -1;
        }

        next->left = node->left;
        if (node->left) avl_set_parent(node->left, next);
        avl_set_parent(next, avl_parent(node));

        // inherit NODE's balance factor
        avl_set_bf(next, avl_bf(node));

    } else {
        // 2. NEXT == NULL (only when there's no right sub-tree)
        p = avl_parent(node);
        if (p) {
            if (p->left == node) {
                p->left = node->left;
                bf = 1;
            } else {
                p->right = node->left;
                bf = -1;
            }
        }
        if (node->left)
            avl_set_parent(node->left, p);

        cur = avl_parent(node);
    }

    // reset root
    if (tree->root == node) {
        tree->root = next;
        if (next == NULL) {
            if (node->left) tree->root = node->left;
        }
    }

    // recursive balancing process .. scan from CUR to root
    while(cur) {
        p = avl_parent(cur);
        if (p) {
            // if parent exists
            bf_old = avl_bf(cur);

            if (p->right == cur) {
                cur = _balance_tree(cur, bf);
                p->right = cur;
            }else {
                cur = _balance_tree(cur, bf);
                p->left = cur;
            }

            // calculate balance facter BF for parent
            if (cur->left == NULL && cur->right == NULL) {
                // leaf node
                if (p->left == cur) bf = 1;
                else bf = -1;
            } else {
                // index ndoe
                bf = 0;
                if (_abs(bf_old) > _abs(avl_bf(cur))) {
                    // if ABS of balance factor decreases
                    // cascade to parent
                    if (p->left == cur) bf = 1;
                    else bf = -1;
                }
            }

        } else if(cur == tree->root){
            tree->root = _balance_tree(tree->root, bf);
            break;
        }
        if (bf == 0) break;

        cur = p;
    }

    __AVL_DEBUG_DISPLAY(tree);
}